

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O1

bool peparse::readRichHeader(bounded_buffer *rich_buf,uint32_t key,rich_header *rich_hdr)

{
  pointer *pprVar1;
  iterator __position;
  rich_entry rVar2;
  bool bVar3;
  long *plVar4;
  long *plVar5;
  _func_ios_base_ptr_ios_base_ptr *f;
  _func_ios_base_ptr_ios_base_ptr *f_00;
  _func_ios_base_ptr_ios_base_ptr *f_01;
  _func_ios_base_ptr_ios_base_ptr *f_02;
  _func_ios_base_ptr_ios_base_ptr *f_03;
  uint32_t offset;
  uint32_t encrypted_dword;
  rich_entry entry;
  long *local_80;
  long local_70;
  long lStack_68;
  uint local_5c;
  string local_58;
  rich_entry local_38;
  
  if (rich_buf != (bounded_buffer *)0x0) {
    bVar3 = readDword(rich_buf,0,&local_5c);
    if (bVar3) {
      if ((local_5c ^ key) != 0x536e6144) {
        rich_hdr->isPresent = false;
        return false;
      }
      rich_hdr->isPresent = true;
      rich_hdr->StartSignature = 0x536e6144;
      if (rich_buf->bufLen - 0x19 < 0xffffffef) {
        offset = 0x10;
        do {
          bVar3 = readDword(rich_buf,offset,&local_5c);
          if (!bVar3) {
            err = 6;
            std::__cxx11::string::_M_replace((ulong)&err_loc_abi_cxx11_,0,DAT_001287f0,0x121f40);
            to_string<unsigned_int>(&local_58,0x4f8,f_01);
            plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x121009);
            local_80 = &local_70;
            plVar5 = plVar4 + 2;
            if ((long *)*plVar4 == plVar5) {
              local_70 = *plVar5;
              lStack_68 = plVar4[3];
            }
            else {
              local_70 = *plVar5;
              local_80 = (long *)*plVar4;
            }
            *plVar4 = (long)plVar5;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&err_loc_abi_cxx11_,(ulong)local_80);
            goto LAB_00114de3;
          }
          local_38._0_4_ = (local_5c ^ key) >> 0x10 | (local_5c ^ key) << 0x10;
          bVar3 = readDword(rich_buf,offset + 4,&local_5c);
          if (!bVar3) {
            err = 6;
            std::__cxx11::string::_M_replace((ulong)&err_loc_abi_cxx11_,0,DAT_001287f0,0x121f40);
            to_string<unsigned_int>(&local_58,0x503,f_02);
            plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x121009);
            local_80 = &local_70;
            plVar5 = plVar4 + 2;
            if ((long *)*plVar4 == plVar5) {
              local_70 = *plVar5;
              lStack_68 = plVar4[3];
            }
            else {
              local_70 = *plVar5;
              local_80 = (long *)*plVar4;
            }
            *plVar4 = (long)plVar5;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&err_loc_abi_cxx11_,(ulong)local_80);
            goto LAB_00114de3;
          }
          local_38.Count = local_5c ^ key;
          __position._M_current =
               (rich_hdr->Entries).
               super__Vector_base<peparse::rich_entry,_std::allocator<peparse::rich_entry>_>._M_impl
               .super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (rich_hdr->Entries).
              super__Vector_base<peparse::rich_entry,_std::allocator<peparse::rich_entry>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<peparse::rich_entry,std::allocator<peparse::rich_entry>>::
            _M_realloc_insert<peparse::rich_entry_const&>
                      ((vector<peparse::rich_entry,std::allocator<peparse::rich_entry>> *)
                       &rich_hdr->Entries,__position,&local_38);
          }
          else {
            rVar2.Count = local_38.Count;
            rVar2.ProductId = local_38.ProductId;
            rVar2.BuildNumber = local_38.BuildNumber;
            *__position._M_current = rVar2;
            pprVar1 = &(rich_hdr->Entries).
                       super__Vector_base<peparse::rich_entry,_std::allocator<peparse::rich_entry>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pprVar1 = *pprVar1 + 1;
          }
          offset = offset + 8;
        } while (offset < rich_buf->bufLen - 8);
      }
      bVar3 = readDword(rich_buf,rich_buf->bufLen - 4,&rich_hdr->EndSignature);
      if (bVar3) {
        if (rich_hdr->EndSignature == 0x68636952) {
          rich_hdr->DecryptionKey = key;
          return true;
        }
        err = 9;
        std::__cxx11::string::_M_replace((ulong)&err_loc_abi_cxx11_,0,DAT_001287f0,0x121f40);
        to_string<unsigned_int>(&local_58,0x514,f_03);
        plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x121009);
        local_80 = &local_70;
        plVar5 = plVar4 + 2;
        if ((long *)*plVar4 == plVar5) {
          local_70 = *plVar5;
          lStack_68 = plVar4[3];
        }
        else {
          local_70 = *plVar5;
          local_80 = (long *)*plVar4;
        }
        *plVar4 = (long)plVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&err_loc_abi_cxx11_,(ulong)local_80);
      }
      else {
        err = 6;
        std::__cxx11::string::_M_replace((ulong)&err_loc_abi_cxx11_,0,DAT_001287f0,0x121f40);
        to_string<unsigned_int>(&local_58,0x510,f_00);
        plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x121009);
        local_80 = &local_70;
        plVar5 = plVar4 + 2;
        if ((long *)*plVar4 == plVar5) {
          local_70 = *plVar5;
          lStack_68 = plVar4[3];
        }
        else {
          local_70 = *plVar5;
          local_80 = (long *)*plVar4;
        }
        *plVar4 = (long)plVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&err_loc_abi_cxx11_,(ulong)local_80);
      }
    }
    else {
      err = 6;
      std::__cxx11::string::_M_replace((ulong)&err_loc_abi_cxx11_,0,DAT_001287f0,0x121f40);
      to_string<unsigned_int>(&local_58,0x4de,f);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x121009);
      local_80 = &local_70;
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        local_70 = *plVar5;
        lStack_68 = plVar4[3];
      }
      else {
        local_70 = *plVar5;
        local_80 = (long *)*plVar4;
      }
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&err_loc_abi_cxx11_,(ulong)local_80);
    }
LAB_00114de3:
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  return false;
}

Assistant:

bool readRichHeader(bounded_buffer *rich_buf,
                    std::uint32_t key,
                    rich_header &rich_hdr) {
  if (rich_buf == nullptr) {
    return false;
  }

  std::uint32_t encrypted_dword;
  std::uint32_t decrypted_dword;

  // Confirm DanS signature exists first.
  // The first decrypted DWORD value of the rich header
  // at offset 0 should be 0x536e6144 aka the "DanS" signature
  if (!readDword(rich_buf, 0, encrypted_dword)) {
    PE_ERR(PEERR_READ);
    return false;
  }

  decrypted_dword = encrypted_dword ^ key;

  if (decrypted_dword == RICH_MAGIC_START) {
    // DanS magic found
    rich_hdr.isPresent = true;
    rich_hdr.StartSignature = decrypted_dword;
  } else {
    // DanS magic not found
    rich_hdr.isPresent = false;
    return false;
  }

  // Iterate over the remaining entries.
  // Start from buffer offset 16 because after "DanS" there
  // are three DWORDs of zero padding that can be skipped over.
  // a DWORD is 4 bytes. Loop is incrementing 8 bytes, however
  // we are reading two DWORDS at a time, which is the size
  // of one rich header entry.
  for (std::uint32_t i = 16; i < rich_buf->bufLen - 8; i += 8) {
    rich_entry entry;
    // Read first DWORD of entry and decrypt it
    if (!readDword(rich_buf, i, encrypted_dword)) {
      PE_ERR(PEERR_READ);
      return false;
    }
    decrypted_dword = encrypted_dword ^ key;
    // The high WORD of the first DWORD is the Product ID
    entry.ProductId = (decrypted_dword & 0xFFFF0000) >> 16;
    // The low WORD of the first DWORD is the Build Number
    entry.BuildNumber = (decrypted_dword & 0xFFFF);

    // The second DWORD represents the use count
    if (!readDword(rich_buf, i + 4, encrypted_dword)) {
      PE_ERR(PEERR_READ);
      return false;
    }
    decrypted_dword = encrypted_dword ^ key;
    // The full 32-bit DWORD is the count
    entry.Count = decrypted_dword;

    // Preserve the individual entry
    rich_hdr.Entries.push_back(entry);
  }

  // Preserve the end signature aka "Rich" magic
  if (!readDword(rich_buf, rich_buf->bufLen - 4, rich_hdr.EndSignature)) {
    PE_ERR(PEERR_READ);
    return false;
  };
  if (rich_hdr.EndSignature != RICH_MAGIC_END) {
    PE_ERR(PEERR_MAGIC);
    return false;
  }

  // Preserve the decryption key
  rich_hdr.DecryptionKey = key;

  return true;
}